

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  char cVar6;
  ImGuiID IVar7;
  uint uVar8;
  ImGuiGroupData *pIVar9;
  ImGuiWindow *pIVar10;
  ulong uVar11;
  undefined8 uVar12;
  bool bVar13;
  ImGuiContext *pIVar14;
  bool bVar15;
  char cVar16;
  long lVar17;
  ImGuiID IVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ImRect local_28;
  ImVec2 local_18;
  
  pIVar14 = GImGui;
  lVar17 = (long)(GImGui->GroupStack).Size;
  pIVar9 = (GImGui->GroupStack).Data;
  pIVar10 = GImGui->CurrentWindow;
  local_28.Min = pIVar9[lVar17 + -1].BackupCursorPos;
  IVar4 = (pIVar10->DC).CursorMaxPos;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = IVar4.x;
  auVar23._4_4_ = IVar4.y;
  IVar5 = pIVar9[lVar17 + -1].BackupCursorPos;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = IVar5.x;
  auVar22._4_4_ = IVar5.y;
  uVar11 = vcmpps_avx512vl(auVar22,auVar23,2);
  bVar19 = (bool)((byte)uVar11 & 1);
  auVar20._0_4_ = (uint)bVar19 * (int)IVar4.x | (uint)!bVar19 * (int)IVar5.x;
  bVar19 = (bool)((byte)(uVar11 >> 1) & 1);
  auVar20._4_4_ = (uint)bVar19 * (int)IVar4.y | (uint)!bVar19 * (int)IVar5.y;
  auVar20._8_8_ = 0;
  local_28.Max = (ImVec2)vmovlps_avx(auVar20);
  (pIVar10->DC).CursorPos = local_28.Min;
  IVar5 = pIVar9[lVar17 + -1].BackupCursorMaxPos;
  auVar24._8_8_ = 0;
  auVar24._0_4_ = IVar5.x;
  auVar24._4_4_ = IVar5.y;
  uVar11 = vcmpps_avx512vl(auVar23,auVar24,2);
  bVar19 = (bool)((byte)uVar11 & 1);
  auVar21._0_4_ = (uint)bVar19 * (int)IVar5.x | (uint)!bVar19 * (int)IVar4.x;
  bVar19 = (bool)((byte)(uVar11 >> 1) & 1);
  auVar21._4_4_ = (uint)bVar19 * (int)IVar5.y | (uint)!bVar19 * (int)IVar4.y;
  auVar21._8_8_ = 0;
  IVar4 = (ImVec2)vmovlps_avx(auVar21);
  (pIVar10->DC).CursorMaxPos = IVar4;
  (pIVar10->DC).Indent.x = pIVar9[lVar17 + -1].BackupIndent.x;
  (pIVar10->DC).GroupOffset.x = pIVar9[lVar17 + -1].BackupGroupOffset.x;
  (pIVar10->DC).CurrLineSize = pIVar9[lVar17 + -1].BackupCurrLineSize;
  fVar2 = pIVar9[lVar17 + -1].BackupCurrLineTextBaseOffset;
  (pIVar10->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar14->LogEnabled == true) {
    pIVar14->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar9[lVar17 + -1].EmitItem != true) goto LAB_002bf547;
  fVar3 = (pIVar10->DC).PrevLineTextBaseOffset;
  uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),2);
  bVar19 = (bool)((byte)uVar12 & 1);
  auVar25._8_8_ = 0;
  auVar25._0_4_ = local_28.Min.x;
  auVar25._4_4_ = local_28.Min.y;
  auVar20 = vsubps_avx(auVar20,auVar25);
  (pIVar10->DC).CurrLineTextBaseOffset =
       (float)((uint)bVar19 * (int)fVar3 + (uint)!bVar19 * (int)fVar2);
  local_18 = (ImVec2)vmovlps_avx(auVar20);
  ItemSize(&local_18,-1.0);
  ItemAdd(&local_28,0,(ImRect *)0x0,1);
  IVar7 = pIVar14->ActiveId;
  if (pIVar9[lVar17 + -1].BackupActiveIdIsAlive == IVar7) {
    if (pIVar9[lVar17 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar6 = pIVar14->ActiveIdPreviousFrameIsAlive;
joined_r0x002bf4e3:
      if (cVar6 != '\0') {
        IVar18 = pIVar14->ActiveIdPreviousFrame;
        cVar6 = '\x01';
        bVar15 = false;
        goto LAB_002bf4d7;
      }
    }
    bVar13 = false;
    cVar16 = '\0';
  }
  else {
    bVar19 = pIVar14->ActiveIdIsAlive != IVar7;
    IVar18 = IVar7;
    if (pIVar9[lVar17 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar6 = pIVar14->ActiveIdPreviousFrameIsAlive;
      bVar15 = true;
      if (IVar7 == 0 || bVar19) goto joined_r0x002bf4e3;
    }
    else {
      bVar13 = false;
      cVar16 = '\0';
      cVar6 = '\0';
      bVar15 = true;
      if (IVar7 == 0 || bVar19) goto LAB_002bf4e9;
    }
LAB_002bf4d7:
    bVar13 = bVar15;
    cVar16 = cVar6;
    (pIVar14->LastItemData).ID = IVar18;
  }
LAB_002bf4e9:
  (pIVar14->LastItemData).Rect.Min = local_28.Min;
  (pIVar14->LastItemData).Rect.Max = local_28.Max;
  if ((pIVar9[lVar17 + -1].BackupHoveredIdIsAlive == false) && (pIVar14->HoveredId != 0)) {
    pIVar1 = &(pIVar14->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar13) && (pIVar14->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar14->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar8 = (pIVar14->LastItemData).StatusFlags;
  (pIVar14->LastItemData).StatusFlags = uVar8 | 0x20;
  if ((cVar16 != '\0') && (IVar7 != pIVar14->ActiveIdPreviousFrame)) {
    (pIVar14->LastItemData).StatusFlags = uVar8 | 0x60;
  }
LAB_002bf547:
  (pIVar14->GroupStack).Size = (pIVar14->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}